

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void av1_highbd_dr_prediction_z2_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy,int bd)

{
  int in_EDX;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000214;
  uint16_t *in_stack_00000218;
  uint16_t *in_stack_00000220;
  ptrdiff_t in_stack_00000228;
  uint16_t *in_stack_00000230;
  int in_stack_0000023c;
  int in_stack_00000294;
  uint16_t *in_stack_00000298;
  uint16_t *in_stack_000002a0;
  ptrdiff_t in_stack_000002a8;
  uint16_t *in_stack_000002b0;
  int in_stack_000002bc;
  int in_stack_00000334;
  uint16_t *in_stack_00000338;
  uint16_t *in_stack_00000340;
  ptrdiff_t in_stack_00000348;
  uint16_t *in_stack_00000350;
  int in_stack_0000035c;
  uint16_t *in_stack_00000438;
  uint16_t *in_stack_00000440;
  ptrdiff_t in_stack_00000448;
  uint16_t *in_stack_00000450;
  int in_stack_00000458;
  int in_stack_0000045c;
  uint16_t *in_stack_000004b8;
  uint16_t *in_stack_000004c0;
  ptrdiff_t in_stack_000004c8;
  uint16_t *in_stack_000004d0;
  int in_stack_000004d8;
  int in_stack_000004dc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  
  if (in_EDX == 4) {
    if ((int)left < 0xc) {
      highbd_dr_prediction_z2_Nx4_avx2
                (in_stack_0000023c,in_stack_00000230,in_stack_00000228,in_stack_00000220,
                 in_stack_00000218,in_stack_00000214,in_stack_00000018,in_stack_00000020,
                 in_stack_ffffffffffffffc0);
    }
    else {
      highbd_dr_prediction_32bit_z2_Nx4_avx2
                (in_stack_0000023c,in_stack_00000230,in_stack_00000228,in_stack_00000220,
                 in_stack_00000218,in_stack_00000214,in_stack_00000018,in_stack_00000020,
                 in_stack_ffffffffffffffc0);
    }
  }
  else if (in_EDX == 8) {
    if ((int)left < 0xc) {
      highbd_dr_prediction_z2_Nx8_avx2
                (in_stack_000002bc,in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
                 in_stack_00000298,in_stack_00000294,in_stack_00000018,in_stack_00000020,
                 in_stack_ffffffffffffffc0);
    }
    else {
      highbd_dr_prediction_32bit_z2_Nx8_avx2
                (in_stack_0000035c,in_stack_00000350,in_stack_00000348,in_stack_00000340,
                 in_stack_00000338,in_stack_00000334,in_stack_00000018,in_stack_00000020,
                 in_stack_ffffffffffffffc0);
    }
  }
  else if ((int)left < 0xc) {
    highbd_dr_prediction_z2_HxW_avx2
              (in_stack_0000045c,in_stack_00000458,in_stack_00000450,in_stack_00000448,
               in_stack_00000440,in_stack_00000438,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_ffffffffffffffc8);
  }
  else {
    highbd_dr_prediction_32bit_z2_HxW_avx2
              (in_stack_000004dc,in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,
               in_stack_000004c0,in_stack_000004b8,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z2_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int upsample_left, int dx, int dy,
                                      int bd) {
  (void)bd;
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx4_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx4_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    case 8:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx8_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx8_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    default:
      if (bd < 12) {
        highbd_dr_prediction_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
  }
}